

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool cppcms::xss::integer_property_functor(char *begin,char *end)

{
  char cVar1;
  char c;
  char *end_local;
  char *begin_local;
  
  begin_local = begin;
  if ((begin != end) && (*begin == '-')) {
    begin_local = begin + 1;
  }
  if (begin_local != end) {
    do {
      if (begin_local == end) {
        return true;
      }
      cVar1 = *begin_local;
    } while (('/' < cVar1) && (begin_local = begin_local + 1, cVar1 < ':'));
  }
  return false;
}

Assistant:

bool integer_property_functor(char const *begin,char const *end) 
	{
		if(begin!=end && *begin=='-')
			begin++;
		if(begin==end)
			return false;
		while(begin!=end) {
			char c= *begin++;
			if(c<'0' || '9'<c)
				return false;
		}
		return true;
	}